

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_atomic.c
# Opt level: O0

void test_atomic(void)

{
  int iVar1;
  tp_task_t *ptVar2;
  ulong uVar3;
  tp_task_t *tasks [20];
  thread_pool_t tp;
  int i;
  
  tp_init(tasks + 0x13,10);
  tp_start(tasks + 0x13);
  for (tp.no_task.__data.__g_signals[1] = 0; (int)tp.no_task.__data.__g_signals[1] < 0x14;
      tp.no_task.__data.__g_signals[1] = tp.no_task.__data.__g_signals[1] + 1) {
    ptVar2 = (tp_task_t *)tp_task_create(f,cleanup,0);
    tasks[(long)(int)tp.no_task.__data.__g_signals[1] + -1] = ptVar2;
    tp_post_task(tasks + 0x13,tasks[(long)(int)tp.no_task.__data.__g_signals[1] + -1]);
  }
  uVar3 = tp_join_tasks(tasks + 0x13);
  if ((uVar3 & 1) == 0) {
    __assert_fail("tp_join_tasks(&tp)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/WqyJh[P]thread_pool/test/test_atomic.c"
                  ,0x34,"void test_atomic()");
  }
  if (tp.has_task.__data.__g_signals[0] != 0) {
    __assert_fail("tp.active_tasks == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/WqyJh[P]thread_pool/test/test_atomic.c"
                  ,0x36,"void test_atomic()");
  }
  iVar1 = queue_len(&tp.threads);
  if (iVar1 == 0) {
    fprintf(_stderr,"The atomic counter is %u\n",(ulong)(uint)acnt);
    fprintf(_stderr,"The non-atomic counter is %u\n",(ulong)(uint)cnt);
    tp_destroy(tasks + 0x13);
    return;
  }
  __assert_fail("queue_isempty(&tp.task_queue)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/WqyJh[P]thread_pool/test/test_atomic.c"
                ,0x37,"void test_atomic()");
}

Assistant:

void test_atomic()
{
    int i;
    thread_pool_t tp;
    tp_task_t *tasks[TASK_NUM];

    tp_init(&tp, THREAD_NUM);
    tp_start(&tp);

    for (i = 0; i < TASK_NUM; ++i) {
        tasks[i] = tp_task_create(f, cleanup, NULL, 0);
        tp_post_task(&tp, tasks[i]);
    }

//    assert(TASK_NUM == tp_post_tasks(&tp, tasks, TASK_NUM));
    assert(tp_join_tasks(&tp));

    assert(tp.active_tasks == 0);
    assert(queue_isempty(&tp.task_queue));

    fprintf(stderr, "The atomic counter is %u\n", acnt);
    fprintf(stderr, "The non-atomic counter is %u\n", cnt);

    tp_destroy(&tp);
}